

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int rar_decode_byte(archive_read *a,uint8_t *byte)

{
  void *pvVar1;
  int iVar2;
  rar_br *br;
  rar *rar;
  uint8_t *byte_local;
  archive_read *a_local;
  
  pvVar1 = a->format->data;
  if (((*(int *)((long)pvVar1 + 0x4f38) < 8) &&
      (iVar2 = rar_br_fillup(a,(rar_br *)((long)pvVar1 + 0x4f30)), iVar2 == 0)) &&
     (*(int *)((long)pvVar1 + 0x4f38) < 8)) {
    return 0;
  }
  *byte = (uint8_t)(((rar_br *)((long)pvVar1 + 0x4f30))->cache_buffer >>
                   ((char)*(undefined4 *)((long)pvVar1 + 0x4f38) - 8U & 0x3f));
  *(int *)((long)pvVar1 + 0x4f38) = *(int *)((long)pvVar1 + 0x4f38) + -8;
  return 1;
}

Assistant:

static int
rar_decode_byte(struct archive_read *a, uint8_t *byte)
{
  struct rar *rar = (struct rar *)(a->format->data);
  struct rar_br *br = &(rar->br);
  if (!rar_br_read_ahead(a, br, 8))
    return 0;
  *byte = (uint8_t)rar_br_bits(br, 8);
  rar_br_consume(br, 8);
  return 1;
}